

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O2

string * __thiscall
cfd::api::json::PsbtGlobalXpub::GetMaster_fingerprintString_abi_cxx11_
          (string *__return_storage_ptr__,PsbtGlobalXpub *this,PsbtGlobalXpub *obj)

{
  core::ConvertToString<std::__cxx11::string>
            (__return_storage_ptr__,(core *)&this->master_fingerprint_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)obj);
  return __return_storage_ptr__;
}

Assistant:

static std::string GetMaster_fingerprintString(  // line separate
      const PsbtGlobalXpub& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.master_fingerprint_);
  }